

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  idx_t iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  char acStack_6c [4];
  char *local_68;
  undefined8 local_60;
  char *local_58;
  bool *local_50;
  ulong local_48;
  idx_t local_40;
  unsigned_long *local_38;
  
  local_50 = result_data;
  local_38 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_40 = count;
  if (local_38 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = (rdata->value).pointer.ptr;
      iVar7 = 0;
      uVar1 = (uint)*(ulong *)&rdata->value;
      uVar10 = *(ulong *)&rdata->value & 0xffffffff;
      do {
        local_58 = ldata[iVar7].value.pointer.ptr;
        local_60 = *(undefined8 *)&ldata[iVar7].value;
        uVar6 = (uint)*(undefined8 *)&ldata[iVar7].value;
        if (uVar6 < uVar1) {
LAB_00a180f0:
          bVar12 = false;
        }
        else if (uVar1 < 5) {
          if (uVar10 == 0) {
            bVar12 = true;
          }
          else {
            lVar2 = 0;
            do {
              bVar12 = *(char *)((long)&local_60 + lVar2 + 4) == acStack_6c[lVar2];
              if (!bVar12) break;
              bVar13 = uVar10 - 1 != lVar2;
              lVar2 = lVar2 + 1;
            } while (bVar13);
          }
        }
        else {
          lVar2 = 0;
          do {
            if (*(char *)((long)&local_60 + lVar2 + 4) != acStack_6c[lVar2]) goto LAB_00a180f0;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          if (uVar6 < 0xd) {
            local_58 = (char *)((long)&local_60 + 4);
          }
          pcVar8 = local_68;
          if (uVar1 < 0xd) {
            pcVar8 = acStack_6c;
          }
          lVar2 = 0;
          do {
            bVar12 = local_58[lVar2 + 4] == pcVar8[lVar2 + 4];
            if (!bVar12) break;
            bVar13 = uVar10 - 5 != lVar2;
            lVar2 = lVar2 + 1;
          } while (bVar13);
        }
        result_data[iVar7] = bVar12;
        iVar7 = iVar7 + 1;
      } while (iVar7 != count);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    uVar3 = 0;
    uVar10 = 0;
    do {
      uVar5 = local_38[uVar3];
      uVar4 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar4 = count;
      }
      uVar11 = uVar4;
      if (uVar5 != 0) {
        uVar11 = uVar10;
        if (uVar5 == 0xffffffffffffffff) {
          if (uVar10 < uVar4) {
            local_68 = (rdata->value).pointer.ptr;
            uVar1 = (uint)*(ulong *)&rdata->value;
            uVar5 = *(ulong *)&rdata->value & 0xffffffff;
            do {
              local_58 = ldata[uVar10].value.pointer.ptr;
              local_60 = *(undefined8 *)&ldata[uVar10].value;
              uVar6 = (uint)*(undefined8 *)&ldata[uVar10].value;
              if (uVar6 < uVar1) {
LAB_00a17ed6:
                bVar12 = false;
              }
              else if (uVar1 < 5) {
                if (uVar5 == 0) {
                  bVar12 = true;
                }
                else {
                  lVar2 = 0;
                  do {
                    bVar12 = *(char *)((long)&local_60 + lVar2 + 4) == acStack_6c[lVar2];
                    if (!bVar12) break;
                    bVar13 = uVar5 - 1 != lVar2;
                    lVar2 = lVar2 + 1;
                  } while (bVar13);
                }
              }
              else {
                lVar2 = 0;
                do {
                  if (*(char *)((long)&local_60 + lVar2 + 4) != acStack_6c[lVar2])
                  goto LAB_00a17ed6;
                  lVar2 = lVar2 + 1;
                } while (lVar2 != 4);
                if (uVar6 < 0xd) {
                  local_58 = (char *)((long)&local_60 + 4);
                }
                pcVar8 = local_68;
                if (uVar1 < 0xd) {
                  pcVar8 = acStack_6c;
                }
                lVar2 = 0;
                do {
                  bVar12 = local_58[lVar2 + 4] == pcVar8[lVar2 + 4];
                  if (!bVar12) break;
                  bVar13 = uVar5 - 5 != lVar2;
                  lVar2 = lVar2 + 1;
                } while (bVar13);
              }
              result_data[uVar10] = bVar12;
              uVar10 = uVar10 + 1;
              uVar11 = uVar10;
            } while (uVar10 != uVar4);
          }
        }
        else if (uVar10 < uVar4) {
          do {
            if ((uVar5 >> ((ulong)(uint)((int)uVar11 - (int)uVar10) & 0x3f) & 1) != 0) {
              local_58 = ldata[uVar11].value.pointer.ptr;
              local_68 = (rdata->value).pointer.ptr;
              local_60 = *(undefined8 *)&ldata[uVar11].value;
              uVar1 = (uint)*(ulong *)&rdata->value;
              uVar6 = (uint)*(undefined8 *)&ldata[uVar11].value;
              if (uVar6 < uVar1) {
LAB_00a17fd8:
                bVar12 = false;
              }
              else {
                uVar9 = *(ulong *)&rdata->value & 0xffffffff;
                if (uVar1 < 5) {
                  if (uVar9 == 0) {
                    bVar12 = true;
                  }
                  else {
                    lVar2 = 0;
                    do {
                      bVar12 = *(char *)((long)&local_60 + lVar2 + 4) == acStack_6c[lVar2];
                      if (!bVar12) break;
                      bVar13 = uVar9 - 1 != lVar2;
                      lVar2 = lVar2 + 1;
                    } while (bVar13);
                  }
                }
                else {
                  lVar2 = 0;
                  do {
                    if (*(char *)((long)&local_60 + lVar2 + 4) != acStack_6c[lVar2])
                    goto LAB_00a17fd8;
                    lVar2 = lVar2 + 1;
                  } while (lVar2 != 4);
                  if (uVar6 < 0xd) {
                    local_58 = (char *)((long)&local_60 + 4);
                  }
                  if (uVar1 < 0xd) {
                    local_68 = acStack_6c;
                  }
                  lVar2 = 0;
                  do {
                    bVar12 = local_58[lVar2 + 4] == local_68[lVar2 + 4];
                    if (!bVar12) break;
                    bVar13 = uVar9 - 5 != lVar2;
                    lVar2 = lVar2 + 1;
                  } while (bVar13);
                }
              }
              result_data[uVar11] = bVar12;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar4);
        }
      }
      uVar3 = uVar3 + 1;
      count = local_40;
      uVar10 = uVar11;
    } while (uVar3 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}